

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall
Wasm::WasmModuleGenerator::WasmModuleGenerator
          (WasmModuleGenerator *this,ScriptContext *scriptContext,WebAssemblySource *src)

{
  Recycler *pRVar1;
  WebAssemblyModule *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pRVar1 = scriptContext->recycler;
  this->m_recycler = pRVar1;
  this->m_sourceInfo = src->sourceInfo;
  this->m_scriptContext = scriptContext;
  local_50 = (undefined1  [8])&Js::WebAssemblyModule::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_ad5ca57;
  data.filename._0_4_ = 0xf6;
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,(TrackAllocData *)local_50);
  this_00 = (WebAssemblyModule *)new<Memory::Recycler>(0xf0,pRVar1,0x391482);
  Js::WebAssemblyModule::WebAssemblyModule
            (this_00,scriptContext,src->buffer,src->bufferLength,
             (((scriptContext->super_ScriptContextBase).javascriptLibrary)->webAssemblyModuleType).
             ptr);
  this->m_module = this_00;
  Js::Utf8SourceInfo::EnsureInitialized(this->m_sourceInfo,0);
  SourceContextInfo::EnsureInitialized
            ((((this->m_sourceInfo->m_srcInfo).ptr)->sourceContextInfo).ptr);
  return;
}

Assistant:

WasmModuleGenerator::WasmModuleGenerator(Js::ScriptContext* scriptContext, Js::WebAssemblySource* src) :
    m_sourceInfo(src->GetSourceInfo()),
    m_scriptContext(scriptContext),
    m_recycler(scriptContext->GetRecycler())
{
    m_module = RecyclerNewFinalized(m_recycler, Js::WebAssemblyModule, scriptContext, src->GetBuffer(), src->GetBufferLength(), scriptContext->GetLibrary()->GetWebAssemblyModuleType());

    m_sourceInfo->EnsureInitialized(0);
    m_sourceInfo->GetSrcInfo()->sourceContextInfo->EnsureInitialized();
}